

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilteringRegister.hpp
# Opt level: O0

int __thiscall
supermap::
FilteringRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::Key<3UL>_>::clone
          (FilteringRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::Key<3UL>_>
           *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  function<supermap::Key<3UL>_(const_supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>_&)>
  *in_stack_00000010;
  anon_class_16_1_552cbcb6 *in_stack_00000018;
  int iVar1;
  unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>
  *this_00;
  unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>
  local_28 [3];
  __fn *local_10;
  FilteringRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::Key<3UL>_>
  *local_8;
  
  this_00 = local_28;
  local_10 = __fn;
  local_8 = this;
  std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>::shared_ptr
            ((shared_ptr<supermap::Filter<supermap::Key<3UL>_>_> *)this,
             (shared_ptr<supermap::Filter<supermap::Key<3UL>_>_> *)this);
  std::
  make_unique<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,supermap::Key<3ul>>,supermap::FilteringRegister<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,supermap::Key<3ul>>::clone()const::_lambda()_1_,std::function<supermap::Key<3ul>(supermap::KeyValue<supermap::Key<3ul>,unsigned_long>const&)>const&>
            (in_stack_00000018,in_stack_00000010);
  std::
  unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>>>>
  ::
  unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,supermap::Key<3ul>>,std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,supermap::Key<3ul>>>,void>
            (this_00,(unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::Key<3UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::Key<3UL>_>_>_>
                      *)__fn);
  std::
  unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::Key<3UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::Key<3UL>_>_>_>
  ::~unique_ptr((unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::Key<3UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::Key<3UL>_>_>_>
                 *)this);
  iVar1 = (int)this;
  const::{lambda()#1}::~clone((anon_class_16_1_552cbcb6 *)0x25fe93);
  return iVar1;
}

Assistant:

std::unique_ptr<StorageItemRegister<RegisterT, std::shared_ptr<FilterBase>>>
    clone() const override {
        return std::make_unique<FilteringRegister<RegisterT, FilterT>>(
            [filter = filter_]() { return filter->clone(); },
            func_
        );
    }